

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O0

int __thiscall pawn_table::init(pawn_table *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int extraout_EAX;
  size_t sVar3;
  ulong uVar4;
  pawn_entry *__p;
  pawn_entry *local_60;
  size_t local_40;
  shared_ptr<pawn_entry[]> local_20;
  pawn_table *local_10;
  pawn_table *this_local;
  
  this->sz_mb = 0x2800;
  this->count = (this->sz_mb << 10) / 0x128;
  local_10 = this;
  sVar3 = pow2(this->count);
  this->count = sVar3;
  if (this->count < 0x400) {
    local_40 = 0x400;
  }
  else {
    local_40 = this->count;
  }
  this->count = local_40;
  uVar1 = this->count;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar4 = SUB168(auVar2 * ZEXT816(0x128),0);
  if (SUB168(auVar2 * ZEXT816(0x128),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __p = (pawn_entry *)operator_new__(uVar4);
  if (uVar1 != 0) {
    local_60 = __p;
    do {
      pawn_entry::pawn_entry(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __p + uVar1);
  }
  std::shared_ptr<pawn_entry[]>::shared_ptr<pawn_entry,void>(&local_20,__p);
  std::shared_ptr<pawn_entry[]>::operator=(&this->entries,&local_20);
  std::shared_ptr<pawn_entry[]>::~shared_ptr(&local_20);
  clear(this);
  return extraout_EAX;
}

Assistant:

void pawn_table::init() {
	sz_mb = 10 * 1024; // todo : input mb parameter
	count = 1024 * sz_mb / sizeof(pawn_entry);
	count = pow2(count);
	count = (count < 1024 ? 1024 : count);
	entries = std::shared_ptr<pawn_entry[]>(new pawn_entry[count]());
	clear();
}